

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_quads_to_grids
          (SceneGraph *this,Ref<embree::SceneGraph::QuadMeshNode> *qmesh,uint resX,uint resY)

{
  Vec3fa *pVVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined8 *puVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pQVar7;
  Vec3fa *pVVar8;
  long lVar9;
  void *ptr;
  undefined8 uVar10;
  uint uVar11;
  GridMeshNode *this_00;
  void *pvVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  QuadMeshNode *pQVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint x;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  Ref<embree::SceneGraph::MaterialNode> local_f8;
  uint local_f0;
  float local_ec;
  uint local_e8;
  Grid local_e4;
  Node *local_d8;
  GridMeshNode *local_d0;
  QuadMeshNode *local_c8;
  ulong local_c0;
  long local_b8;
  size_t local_b0;
  size_t local_a8;
  long local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pQVar17 = qmesh->ptr;
  pvVar5 = (pQVar17->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = (pQVar17->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (Node *)this;
  this_00 = (GridMeshNode *)::operator_new(0xa8);
  local_f8.ptr = (pQVar17->material).ptr;
  local_d0 = this_00;
  if (local_f8.ptr != (MaterialNode *)0x0) {
    (*((local_f8.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
    pQVar17 = qmesh->ptr;
  }
  local_b0 = (long)pvVar5 - (long)pvVar6 >> 5;
  GridMeshNode::GridMeshNode(this_00,&local_f8,pQVar17->time_range,local_b0);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_f8.ptr != (MaterialNode *)0x0) {
    (*((local_f8.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_c8 = qmesh->ptr;
  local_ec = (float)(resY - 1);
  local_d0 = (GridMeshNode *)&local_d0->grids;
  uVar16 = 0;
  while (uVar16 < (ulong)((long)(local_c8->quads).
                                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_c8->quads).
                                super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    local_f0 = (uint)((this_00->positions).
                      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->size_active;
    local_b8 = uVar16 << 4;
    sVar14 = 0;
    local_c0 = uVar16;
    while (sVar14 != local_b0) {
      pQVar7 = (local_c8->quads).
               super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = sVar14 * 0x20;
      pVVar8 = (qmesh->ptr->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar14].items;
      pVVar1 = pVVar8 + *(uint *)((long)&pQVar7->v0 + local_b8);
      fVar24 = (pVVar1->field_0).m128[0];
      fVar25 = (pVVar1->field_0).m128[1];
      fVar26 = (pVVar1->field_0).m128[2];
      fVar27 = (pVVar1->field_0).m128[3];
      pVVar1 = pVVar8 + *(uint *)((long)&pQVar7->v1 + local_b8);
      fVar28 = (pVVar1->field_0).m128[0];
      fVar29 = (pVVar1->field_0).m128[1];
      fVar30 = (pVVar1->field_0).m128[2];
      fVar31 = (pVVar1->field_0).m128[3];
      pVVar1 = pVVar8 + *(uint *)((long)&pQVar7->v3 + local_b8);
      fVar32 = (pVVar1->field_0).m128[0];
      fVar33 = (pVVar1->field_0).m128[1];
      fVar34 = (pVVar1->field_0).m128[2];
      fVar35 = (pVVar1->field_0).m128[3];
      pVVar8 = pVVar8 + *(uint *)((long)&pQVar7->v2 + local_b8);
      fVar36 = (pVVar8->field_0).m128[0];
      fVar37 = (pVVar8->field_0).m128[1];
      fVar38 = (pVVar8->field_0).m128[2];
      fVar39 = (pVVar8->field_0).m128[3];
      uVar11 = 0;
      local_a8 = sVar14;
      local_a0 = lVar18;
      local_98 = fVar36;
      fStack_94 = fVar37;
      fStack_90 = fVar38;
      fStack_8c = fVar39;
      local_88 = fVar32;
      fStack_84 = fVar33;
      fStack_80 = fVar34;
      fStack_7c = fVar35;
      local_78 = fVar28;
      fStack_74 = fVar29;
      fStack_70 = fVar30;
      fStack_6c = fVar31;
      local_68 = fVar24;
      fStack_64 = fVar25;
      fStack_60 = fVar26;
      fStack_5c = fVar27;
      while (uVar11 != resY) {
        fVar40 = (float)uVar11 / local_ec;
        fVar44 = 1.0 - fVar40;
        fVar41 = fVar40;
        fVar42 = fVar40;
        fVar43 = fVar40;
        fVar45 = fVar44;
        fVar46 = fVar44;
        fVar47 = fVar44;
        local_e8 = uVar11;
        local_58 = fVar44;
        fStack_54 = fVar44;
        fStack_50 = fVar44;
        fStack_4c = fVar44;
        local_48 = fVar40;
        fStack_44 = fVar40;
        fStack_40 = fVar40;
        fStack_3c = fVar40;
        for (uVar21 = 0; uVar21 != resX; uVar21 = uVar21 + 1) {
          pvVar5 = (this_00->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = *(long *)((long)&pvVar5->size_active + lVar18);
          uVar15 = *(ulong *)((long)&pvVar5->size_alloced + lVar18);
          uVar16 = lVar9 + 1;
          lVar13 = lVar18;
          if (uVar15 < uVar16) {
            uVar19 = uVar15;
            uVar20 = uVar16;
            if (uVar15 != 0) {
              for (; uVar20 = uVar19, uVar19 < uVar16;
                  uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
              }
            }
            if (uVar15 != uVar20) {
              ptr = *(void **)((long)&pvVar5->items + lVar18);
              pvVar12 = alignedMalloc(uVar20 << 4,0x10);
              *(void **)((long)&pvVar5->items + lVar18) = pvVar12;
              lVar13 = 0;
              for (uVar15 = 0; uVar15 < *(ulong *)((long)&pvVar5->size_active + lVar18);
                  uVar15 = uVar15 + 1) {
                puVar4 = (undefined8 *)((long)ptr + lVar13);
                uVar10 = puVar4[1];
                puVar2 = (undefined8 *)(*(long *)((long)&pvVar5->items + lVar18) + lVar13);
                *puVar2 = *puVar4;
                puVar2[1] = uVar10;
                lVar13 = lVar13 + 0x10;
              }
              alignedFree(ptr);
              *(long *)((long)&pvVar5->size_active + lVar18) = lVar9;
              *(ulong *)((long)&pvVar5->size_alloced + lVar18) = uVar20;
              lVar13 = local_a0;
              fVar24 = local_68;
              fVar25 = fStack_64;
              fVar26 = fStack_60;
              fVar27 = fStack_5c;
              fVar28 = local_78;
              fVar29 = fStack_74;
              fVar30 = fStack_70;
              fVar31 = fStack_6c;
              fVar32 = local_88;
              fVar33 = fStack_84;
              fVar34 = fStack_80;
              fVar35 = fStack_7c;
              fVar36 = local_98;
              fVar37 = fStack_94;
              fVar38 = fStack_90;
              fVar39 = fStack_8c;
              fVar40 = local_48;
              fVar41 = fStack_44;
              fVar42 = fStack_40;
              fVar43 = fStack_3c;
              fVar44 = local_58;
              fVar45 = fStack_54;
              fVar46 = fStack_50;
              fVar47 = fStack_4c;
            }
          }
          fVar22 = (float)uVar21 / (float)(resX - 1);
          fVar23 = 1.0 - fVar22;
          *(ulong *)((long)&pvVar5->size_active + lVar18) = uVar16;
          pfVar3 = (float *)(*(long *)((long)&pvVar5->items + lVar18) + lVar9 * 0x10);
          *pfVar3 = fVar22 * fVar36 * fVar40 +
                    fVar23 * fVar32 * fVar40 + fVar28 * fVar22 * fVar44 + fVar24 * fVar23 * fVar44;
          pfVar3[1] = fVar22 * fVar37 * fVar41 +
                      fVar23 * fVar33 * fVar41 + fVar29 * fVar22 * fVar45 + fVar25 * fVar23 * fVar45
          ;
          pfVar3[2] = fVar22 * fVar38 * fVar42 +
                      fVar23 * fVar34 * fVar42 + fVar30 * fVar22 * fVar46 + fVar26 * fVar23 * fVar46
          ;
          pfVar3[3] = fVar22 * fVar39 * fVar43 +
                      fVar23 * fVar35 * fVar43 + fVar31 * fVar22 * fVar47 + fVar27 * fVar23 * fVar47
          ;
          lVar18 = lVar13;
        }
        uVar11 = local_e8 + 1;
      }
      sVar14 = local_a8 + 1;
    }
    local_e4.startVtx = local_f0;
    local_e4.resX = (unsigned_short)resX;
    local_e4.resY = (unsigned_short)resY;
    local_e4.lineStride = resX;
    std::
    vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
    ::emplace_back<embree::SceneGraph::GridMeshNode::Grid>
              ((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                *)local_d0,&local_e4);
    uVar16 = local_c0 + 1;
  }
  (local_d8->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_d8;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_grids ( Ref<SceneGraph::QuadMeshNode> qmesh , const unsigned int resX, const unsigned int resY )
  {
    const size_t timeSteps = qmesh->positions.size();
    Ref<SceneGraph::GridMeshNode> gmesh = new SceneGraph::GridMeshNode(qmesh->material,qmesh->time_range,timeSteps);
    std::vector<SceneGraph::QuadMeshNode::Quad>& quads = qmesh->quads;

    for (size_t i=0;i<quads.size();i++)
    {
      const unsigned int startVtx = (unsigned int) gmesh->positions[0].size();
      const unsigned int lineStride = resX;
      for (size_t t=0;t<timeSteps;t++)
      {
        const SceneGraph::GridMeshNode::Vertex v00 = qmesh->positions[t][quads[i].v0];
        const SceneGraph::GridMeshNode::Vertex v01 = qmesh->positions[t][quads[i].v1];
        const SceneGraph::GridMeshNode::Vertex v10 = qmesh->positions[t][quads[i].v3];
        const SceneGraph::GridMeshNode::Vertex v11 = qmesh->positions[t][quads[i].v2];
        for (unsigned int y=0; y<resY; y++)
        {
          for (unsigned int x=0; x<resX; x++)
          {
            const float u = (float)x / (resX-1);
            const float v = (float)y / (resY-1);
            const SceneGraph::GridMeshNode::Vertex vtx = v00 * (1.0f-u) * (1.0f-v) + v01 * u * (1.0f-v) + v10 * (1.0f-u) * v + v11 * u * v;
            gmesh->positions[t].push_back( vtx );
          }
        }
      }
      assert(startVtx + resX * resY == gmesh->positions[0].size());
      gmesh->grids.push_back(SceneGraph::GridMeshNode::Grid(startVtx,lineStride,resX,resY));
    }
    return gmesh.dynamicCast<SceneGraph::Node>();
  }